

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int cm_zlib_deflateSetDictionary(z_streamp strm,Bytef *dictionary,uInt dictLength)

{
  uInt uVar1;
  uInt uVar2;
  uint uVar3;
  deflate_state *s;
  Bytef *pBVar4;
  Bytef *pBVar5;
  Posf *pPVar6;
  Posf *pPVar7;
  int iVar8;
  int iVar9;
  uLong uVar10;
  uint uVar11;
  uInt uVar12;
  ulong uVar13;
  uInt uVar14;
  
  iVar8 = deflateStateCheck(strm);
  if (dictionary == (Bytef *)0x0) {
    return -2;
  }
  if (iVar8 != 0) {
    return -2;
  }
  s = strm->state;
  iVar8 = s->wrap;
  if (iVar8 == 2) {
    return -2;
  }
  if (iVar8 == 1) {
    if (s->status != 0x2a) {
      return -2;
    }
    if (s->lookahead != 0) {
      return -2;
    }
    uVar10 = cm_zlib_adler32(strm->adler,dictionary,dictLength);
    strm->adler = uVar10;
    s->wrap = 0;
    uVar11 = s->w_size;
    if (dictLength < uVar11) goto LAB_00239a16;
  }
  else {
    if (s->lookahead != 0) {
      return -2;
    }
    s->wrap = 0;
    uVar11 = s->w_size;
    if (dictLength < uVar11) goto LAB_00239a16;
    if (iVar8 == 0) {
      pPVar6 = s->head;
      uVar13 = (ulong)(s->hash_size - 1);
      pPVar6[uVar13] = 0;
      memset(pPVar6,0,uVar13 * 2);
      s->strstart = 0;
      s->block_start = 0;
      s->insert = 0;
      uVar11 = s->w_size;
    }
  }
  dictionary = dictionary + (dictLength - uVar11);
  dictLength = uVar11;
LAB_00239a16:
  uVar1 = strm->avail_in;
  pBVar4 = strm->next_in;
  strm->avail_in = dictLength;
  strm->next_in = dictionary;
  fill_window(s);
  uVar2 = s->lookahead;
  while (2 < uVar2) {
    uVar12 = s->strstart;
    iVar9 = uVar2 - 2;
    uVar2 = s->hash_shift;
    pBVar5 = s->window;
    uVar11 = s->hash_mask;
    pPVar6 = s->head;
    pPVar7 = s->prev;
    uVar3 = s->w_mask;
    uVar14 = s->ins_h;
    do {
      uVar14 = ((uint)pBVar5[uVar12 + 2] ^ uVar14 << ((byte)uVar2 & 0x1f)) & uVar11;
      s->ins_h = uVar14;
      pPVar7[uVar3 & uVar12] = pPVar6[uVar14];
      pPVar6[uVar14] = (Posf)uVar12;
      uVar12 = uVar12 + 1;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    s->strstart = uVar12;
    s->lookahead = 2;
    fill_window(s);
    uVar2 = s->lookahead;
  }
  uVar11 = s->strstart + uVar2;
  s->strstart = uVar11;
  s->block_start = (ulong)uVar11;
  s->insert = uVar2;
  s->lookahead = 0;
  s->prev_length = 2;
  s->match_length = 2;
  s->match_available = 0;
  strm->next_in = pBVar4;
  strm->avail_in = uVar1;
  s->wrap = iVar8;
  return 0;
}

Assistant:

int ZEXPORT deflateSetDictionary(z_streamp strm, const Bytef *dictionary,
                                 uInt  dictLength) {
    deflate_state *s;
    uInt str, n;
    int wrap;
    unsigned avail;
    z_const unsigned char *next;

    if (deflateStateCheck(strm) || dictionary == Z_NULL)
        return Z_STREAM_ERROR;
    s = strm->state;
    wrap = s->wrap;
    if (wrap == 2 || (wrap == 1 && s->status != INIT_STATE) || s->lookahead)
        return Z_STREAM_ERROR;

    /* when using zlib wrappers, compute Adler-32 for provided dictionary */
    if (wrap == 1)
        strm->adler = adler32(strm->adler, dictionary, dictLength);
    s->wrap = 0;                    /* avoid computing Adler-32 in read_buf */

    /* if dictionary would fill window, just replace the history */
    if (dictLength >= s->w_size) {
        if (wrap == 0) {            /* already empty otherwise */
            CLEAR_HASH(s);
            s->strstart = 0;
            s->block_start = 0L;
            s->insert = 0;
        }
        dictionary += dictLength - s->w_size;  /* use the tail */
        dictLength = s->w_size;
    }

    /* insert dictionary into window and hash */
    avail = strm->avail_in;
    next = strm->next_in;
    strm->avail_in = dictLength;
    strm->next_in = (z_const Bytef *)dictionary;
    fill_window(s);
    while (s->lookahead >= MIN_MATCH) {
        str = s->strstart;
        n = s->lookahead - (MIN_MATCH-1);
        do {
            UPDATE_HASH(s, s->ins_h, s->window[str + MIN_MATCH-1]);
#ifndef FASTEST
            s->prev[str & s->w_mask] = s->head[s->ins_h];
#endif
            s->head[s->ins_h] = (Pos)str;
            str++;
        } while (--n);
        s->strstart = str;
        s->lookahead = MIN_MATCH-1;
        fill_window(s);
    }
    s->strstart += s->lookahead;
    s->block_start = (long)s->strstart;
    s->insert = s->lookahead;
    s->lookahead = 0;
    s->match_length = s->prev_length = MIN_MATCH-1;
    s->match_available = 0;
    strm->next_in = next;
    strm->avail_in = avail;
    s->wrap = wrap;
    return Z_OK;
}